

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O3

CURLcode formdata_add_filename(curl_httppost *file,FormData **form,curl_off_t *size)

{
  curl_malloc_callback p_Var1;
  curl_strdup_callback p_Var2;
  CURLcode CVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  char cVar8;
  char *pcVar9;
  
  pcVar9 = file->showfilename;
  if (pcVar9 == (char *)0x0) {
    pcVar7 = (*Curl_cstrdup)(file->contents);
    p_Var2 = Curl_cstrdup;
    if (pcVar7 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    pcVar9 = __xpg_basename(pcVar7);
    pcVar9 = (*p_Var2)(pcVar9);
    (*Curl_cfree)(pcVar7);
    pcVar7 = pcVar9;
    if (pcVar9 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  else {
    pcVar7 = (char *)0x0;
  }
  pcVar4 = strchr(pcVar9,0x5c);
  if ((pcVar4 != (char *)0x0) || (pcVar4 = strchr(pcVar9,0x22), pcVar4 != (char *)0x0)) {
    p_Var1 = Curl_cmalloc;
    sVar5 = strlen(pcVar9);
    pcVar4 = (char *)(*p_Var1)(sVar5 * 2 + 1);
    pcVar6 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      do {
        cVar8 = *pcVar9;
        if ((cVar8 == '\"') || (cVar8 == '\\')) {
          *pcVar6 = '\\';
          pcVar6 = pcVar6 + 1;
          cVar8 = *pcVar9;
        }
        else if (cVar8 == '\0') goto LAB_00529f09;
        pcVar9 = pcVar9 + 1;
        *pcVar6 = cVar8;
        pcVar6 = pcVar6 + 1;
      } while( true );
    }
    CVar3 = CURLE_OUT_OF_MEMORY;
    goto LAB_00529f8b;
  }
  pcVar4 = (char *)0x0;
LAB_00529f66:
  CVar3 = AddFormDataf(form,size,"; filename=\"%s\"",pcVar9);
  (*Curl_cfree)(pcVar4);
LAB_00529f8b:
  (*Curl_cfree)(pcVar7);
  return CVar3;
LAB_00529f09:
  *pcVar6 = '\0';
  pcVar9 = pcVar4;
  goto LAB_00529f66;
}

Assistant:

static CURLcode formdata_add_filename(const struct curl_httppost *file,
                                      struct FormData **form,
                                      curl_off_t *size)
{
  CURLcode result = CURLE_OK;
  char *filename = file->showfilename;
  char *filebasename = NULL;
  char *filename_escaped = NULL;

  if(!filename) {
    filebasename = strippath(file->contents);
    if(!filebasename)
      return CURLE_OUT_OF_MEMORY;
    filename = filebasename;
  }

  if(strchr(filename, '\\') || strchr(filename, '"')) {
    char *p0, *p1;

    /* filename need be escaped */
    filename_escaped = malloc(strlen(filename)*2+1);
    if(!filename_escaped) {
      free(filebasename);
      return CURLE_OUT_OF_MEMORY;
    }
    p0 = filename_escaped;
    p1 = filename;
    while(*p1) {
      if(*p1 == '\\' || *p1 == '"')
        *p0++ = '\\';
      *p0++ = *p1++;
    }
    *p0 = '\0';
    filename = filename_escaped;
  }
  result = AddFormDataf(form, size,
                        "; filename=\"%s\"",
                        filename);
  free(filename_escaped);
  free(filebasename);
  return result;
}